

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  uint *puVar4;
  uint *puVar5;
  void *__ptr;
  int *__s;
  ulong uVar6;
  uchar *puVar7;
  unsigned_short *puVar8;
  size_t sVar9;
  uchar uVar10;
  byte bVar11;
  uint i;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint result;
  uint reverse2;
  uint uVar17;
  uint uVar18;
  size_t sVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  uint uVar24;
  undefined1 auVar25 [16];
  
  uVar6 = (ulong)tree->numcodes;
  puVar5 = (uint *)malloc(uVar6 * 4);
  tree->codes = puVar5;
  uVar24 = tree->maxbitlen;
  uVar18 = uVar24 + 1;
  sVar19 = (ulong)uVar18 * 4;
  __ptr = malloc(sVar19);
  __s = (int *)malloc(sVar19);
  bVar20 = puVar5 == (uint *)0x0;
  bVar21 = __ptr == (void *)0x0;
  bVar22 = __s == (int *)0x0;
  uVar17 = 0x53;
  if (!bVar22 && (!bVar21 && !bVar20)) {
    uVar17 = 0;
  }
  if (bVar22 || (bVar21 || bVar20)) {
    free(__ptr);
  }
  else {
    if (uVar18 != 0) {
      sVar19 = (ulong)uVar18 << 2;
      memset(__s,0,sVar19);
      memset(__ptr,0,sVar19);
    }
    if (uVar6 != 0) {
      puVar4 = tree->lengths;
      uVar13 = 0;
      do {
        piVar1 = (int *)((long)__ptr + (ulong)puVar4[uVar13] * 4);
        *piVar1 = *piVar1 + 1;
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    if (uVar24 != 0) {
      uVar6 = 2;
      if (2 < uVar18) {
        uVar6 = (ulong)uVar18;
      }
      iVar12 = *__s;
      lVar15 = 0;
      do {
        iVar12 = (iVar12 + *(int *)((long)__ptr + lVar15 * 4)) * 2;
        __s[lVar15 + 1] = iVar12;
        lVar15 = lVar15 + 1;
      } while (uVar6 - 1 != lVar15);
    }
    uVar6 = (ulong)tree->numcodes;
    if (uVar6 != 0) {
      puVar4 = tree->lengths;
      uVar13 = 0;
      do {
        uVar14 = (ulong)puVar4[uVar13];
        if (uVar14 != 0) {
          uVar24 = __s[uVar14];
          __s[uVar14] = uVar24 + 1;
          puVar5[uVar13] = uVar24;
          puVar5[uVar13] = ~(-1 << ((byte)puVar4[uVar13] & 0x1f)) & uVar24;
        }
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    free(__ptr);
    free(__s);
    if (bVar22 || (bVar21 || bVar20)) {
      return uVar17;
    }
    __s = (int *)malloc(0x800);
    if (__s == (int *)0x0) {
      return 0x53;
    }
    memset(__s,0,0x800);
    if (uVar6 != 0) {
      puVar4 = tree->lengths;
      uVar13 = 0;
      do {
        uVar24 = puVar4[uVar13];
        if (9 < uVar24) {
          uVar14 = 0;
          uVar17 = 8;
          iVar12 = 0;
          do {
            uVar14 = (ulong)((uint)uVar14 |
                            (uint)(((puVar5[uVar13] >> ((char)uVar24 - 9U & 0x1f)) >>
                                    (uVar17 & 0x1f) & 1) != 0) << ((byte)iVar12 & 0x1f));
            iVar12 = iVar12 + 1;
            uVar17 = uVar17 - 1;
          } while (iVar12 != 9);
          if (uVar24 < (uint)__s[uVar14]) {
            uVar24 = __s[uVar14];
          }
          __s[uVar14] = uVar24;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar6);
    }
    auVar23 = ZEXT416(0x200);
    lVar15 = 0;
    do {
      uVar24 = (uint)*(undefined8 *)(__s + lVar15);
      uVar17 = (uint)((ulong)*(undefined8 *)(__s + lVar15) >> 0x20);
      auVar25._0_8_ =
           CONCAT44(-(uint)(-0x7ffffff7 < (int)(uVar24 ^ 0x80000000)),
                    -(uint)(-0x7ffffff7 < (int)(uVar24 ^ 0x80000000)));
      auVar25._8_4_ = -(uint)(-0x7ffffff7 < (int)(uVar17 ^ 0x80000000));
      auVar25._12_4_ = -(uint)(-0x7ffffff7 < (int)(uVar17 ^ 0x80000000));
      lVar16 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + (1L << (ulong)(uVar24 - 9) & auVar25._0_8_);
      auVar23._8_8_ = lVar16 + (auVar25._8_8_ & 1);
      lVar15 = lVar15 + 2;
    } while (lVar15 != 0x200);
    sVar19 = auVar23._8_8_ + auVar23._0_8_;
    puVar7 = (uchar *)malloc(sVar19);
    tree->table_len = puVar7;
    puVar8 = (unsigned_short *)malloc(sVar19 * 2);
    tree->table_value = puVar8;
    uVar17 = 0x53;
    if (puVar8 != (unsigned_short *)0x0 && puVar7 != (uchar *)0x0) {
      if (sVar19 != 0) {
        sVar9 = 0;
        do {
          tree->table_len[sVar9] = '\x10';
          sVar9 = sVar9 + 1;
        } while (sVar19 != sVar9);
      }
      lVar15 = 0x200;
      lVar16 = 0;
      do {
        if (9 < (uint)__s[lVar16]) {
          uVar10 = (uchar)__s[lVar16];
          tree->table_len[lVar16] = uVar10;
          tree->table_value[lVar16] = (unsigned_short)lVar15;
          lVar15 = lVar15 + (1L << (uVar10 - 9 & 0x3f));
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x200);
      free(__s);
      if (tree->numcodes != 0) {
        uVar6 = 0;
        uVar13 = 0;
        do {
          uVar24 = tree->lengths[uVar6];
          if (uVar24 == 0) {
            bVar20 = false;
          }
          else {
            uVar18 = 0;
            bVar11 = 0;
            uVar17 = uVar24;
            do {
              uVar17 = uVar17 - 1;
              uVar18 = uVar18 | (uint)((tree->codes[uVar6] >> (uVar17 & 0x1f) & 1) != 0) <<
                                (bVar11 & 0x1f);
              bVar11 = bVar11 + 1;
            } while (uVar17 != 0);
            uVar13 = uVar13 + 1;
            bVar11 = (byte)uVar24;
            if (uVar24 < 10) {
              bVar20 = true;
              uVar24 = 1;
              do {
                uVar17 = uVar24 - 1 << (bVar11 & 0x1f) | uVar18;
                if (tree->table_len[uVar17] != '\x10') goto LAB_001ea4a6;
                tree->table_len[uVar17] = bVar11;
                tree->table_value[uVar17] = (unsigned_short)uVar6;
                uVar17 = uVar24 >> (9 - bVar11 & 0x1f);
                uVar24 = uVar24 + 1;
              } while (uVar17 == 0);
            }
            else {
              bVar2 = tree->table_len[uVar18 & 0x1ff];
              bVar20 = true;
              if (bVar2 < uVar24) goto LAB_001ea4a6;
              uVar3 = tree->table_value[uVar18 & 0x1ff];
              uVar24 = 1;
              do {
                uVar17 = (uVar24 - 1 << (bVar11 - 9 & 0x1f) | uVar18 >> 9) + (uint)uVar3;
                tree->table_len[uVar17] = bVar11;
                tree->table_value[uVar17] = (unsigned_short)uVar6;
                uVar17 = uVar24 >> (bVar2 - bVar11 & 0x1f);
                uVar24 = uVar24 + 1;
              } while (uVar17 == 0);
            }
            bVar20 = false;
          }
LAB_001ea4a6:
          if (bVar20) {
            return 0x37;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < tree->numcodes);
        if (1 < uVar13) {
          if (sVar19 == 0) {
            return 0;
          }
          sVar9 = 0;
          do {
            if (tree->table_len[sVar9] == '\x10') {
              return 0x37;
            }
            sVar9 = sVar9 + 1;
          } while (sVar19 != sVar9);
          return 0;
        }
      }
      if (sVar19 == 0) {
        return 0;
      }
      uVar6 = 0;
      do {
        if (tree->table_len[uVar6] == '\x10') {
          tree->table_len[uVar6] = (0x1ff < uVar6) * '\t' + '\x01';
          tree->table_value[uVar6] = 0xffff;
        }
        uVar6 = uVar6 + 1;
      } while (sVar19 != uVar6);
      return 0;
    }
  }
  free(__s);
  return uVar17;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree) {
  unsigned* blcount;
  unsigned* nextcode;
  unsigned error = 0;
  unsigned bits, n;

  tree->codes = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  blcount = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  nextcode = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  if(!tree->codes || !blcount || !nextcode) error = 83; /*alloc fail*/

  if(!error) {
    for(n = 0; n != tree->maxbitlen + 1; n++) blcount[n] = nextcode[n] = 0;
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits) {
      nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1u;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n) {
      if(tree->lengths[n] != 0) {
        tree->codes[n] = nextcode[tree->lengths[n]]++;
        /*remove superfluous bits from the code*/
        tree->codes[n] &= ((1u << tree->lengths[n]) - 1u);
      }
    }
  }

  lodepng_free(blcount);
  lodepng_free(nextcode);

  if(!error) error = HuffmanTree_makeTable(tree);
  return error;
}